

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_mcode.c
# Opt level: O2

void mcode_protfail(jit_State *J)

{
  code *UNRECOVERED_JUMPTABLE;
  lua_State *L;
  TValue *pTVar1;
  GCstr *pGVar2;
  
  UNRECOVERED_JUMPTABLE = *(code **)&J[-1].penalty[0x3a].val;
  if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
    L = J->L;
    pTVar1 = L->top;
    L->top = pTVar1 + 1;
    pGVar2 = lj_err_str(L,LJ_ERR_JITPROT);
    pTVar1->u64 = (ulong)pGVar2 | 0xfffd800000000000;
    (*UNRECOVERED_JUMPTABLE)(L);
    return;
  }
  return;
}

Assistant:

static LJ_NOINLINE void mcode_protfail(jit_State *J)
{
  lua_CFunction panic = J2G(J)->panic;
  if (panic) {
    lua_State *L = J->L;
    setstrV(L, L->top++, lj_err_str(L, LJ_ERR_JITPROT));
    panic(L);
  }
}